

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<void*>::addAll<void**,true>(ArrayBuilder<void*> *this,void **start,void **end)

{
  undefined8 *puVar1;
  
  puVar1 = *(undefined8 **)(this + 8);
  for (; start != end; start = start + 1) {
    *puVar1 = *start;
    puVar1 = puVar1 + 1;
  }
  *(undefined8 **)(this + 8) = puVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}